

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall Diligent::DescriptorSetAllocation::Release(DescriptorSetAllocation *this)

{
  undefined8 in_RCX;
  VkDescriptorPool Pool;
  VkDescriptorSet Set;
  DescriptorSetAllocator *this_00;
  string msg;
  
  Set = this->Set;
  if (Set != (VkDescriptorSet)0x0) {
    Pool = this->Pool;
    this_00 = this->DescrSetAllocator;
    if (Pool == (VkDescriptorPool)0x0 || this_00 == (DescriptorSetAllocator *)0x0) {
      FormatString<char[26],char[55]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DescrSetAllocator != nullptr && Pool != VK_NULL_HANDLE",
                 (char (*) [55])
                 CONCAT71((int7)((ulong)in_RCX >> 8),
                          Pool == (VkDescriptorPool)0x0 || this_00 == (DescriptorSetAllocator *)0x0)
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Release",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
                 ,0x27);
      std::__cxx11::string::~string((string *)&msg);
      this_00 = this->DescrSetAllocator;
      Set = this->Set;
      Pool = this->Pool;
    }
    DescriptorSetAllocator::FreeDescriptorSet(this_00,Set,Pool,this->CmdQueueMask);
    this->CmdQueueMask = 0;
    this->DescrSetAllocator = (DescriptorSetAllocator *)0x0;
    this->Set = (VkDescriptorSet)0x0;
    this->Pool = (VkDescriptorPool)0x0;
  }
  return;
}

Assistant:

void DescriptorSetAllocation::Release()
{
    if (Set != VK_NULL_HANDLE)
    {
        VERIFY_EXPR(DescrSetAllocator != nullptr && Pool != VK_NULL_HANDLE);
        DescrSetAllocator->FreeDescriptorSet(Set, Pool, CmdQueueMask);

        Reset();
    }
}